

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::FilteredDirectoryContentsTask::start
          (FilteredDirectoryContentsTask *this,TaskInterface ti)

{
  char *pcVar1;
  BuildKey *this_00;
  StringRef path;
  StringRef path_00;
  BuildKey local_d0;
  KeyType local_b0;
  BuildKey *local_90;
  BuildKey local_80;
  KeyType local_60;
  FilteredDirectoryContentsTask *local_40;
  FilteredDirectoryContentsTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (FilteredDirectoryContentsTask *)ti.impl;
  ti_local.ctx = &this->path;
  local_40 = this;
  local_90 = (BuildKey *)std::__cxx11::string::data();
  pcVar1 = (char *)std::__cxx11::string::length();
  path.Length = (size_t)pcVar1;
  path.Data = pcVar1;
  llbuild::buildsystem::BuildKey::makeNode(&local_80,local_90,path);
  llbuild::buildsystem::BuildKey::toData(&local_60,&local_80);
  llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_60,0);
  llbuild::core::KeyType::~KeyType(&local_60);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_80);
  this_00 = (BuildKey *)std::__cxx11::string::data();
  pcVar1 = (char *)std::__cxx11::string::length();
  path_00.Length = (size_t)pcVar1;
  path_00.Data = pcVar1;
  llbuild::buildsystem::BuildKey::makeStat(&local_d0,this_00,path_00);
  llbuild::buildsystem::BuildKey::toData(&local_b0,&local_d0);
  llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_b0,1);
  llbuild::core::KeyType::~KeyType(&local_b0);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_d0);
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // FIXME:
    //
    //engine.taskMustFollow(this, BuildKey::makeNode(path).toData());
    //
    // The taskMustFollow method expresses the weak dependency we have on
    // 'path', but only at the task level. What we really want is to say at the
    // 'isResultValid'/scanning level is 'must scan after'. That way we hold up
    // this and downstream rules until the 'path' node has been set into its
    // final state*.
    //
    // Here we depend on the file node so that it can be connected up to
    // potential producers and the raw stat information, in case something else
    // has changed the contents of the directory. The value does not encode the
    // raw stat information, thus will produce the same result if the filtered
    // contents is otherwise the same. This reduces unnecessary rebuilds. That
    // said, we are still subject to the 'final state' problem:
    //
    // * The 'final state' of a directory is also a thorny patch of toxic land
    // mines. We really want directory contents to weakly depend upon anything
    // that is currently and/or may be altered within it. i.e. if one rule
    // creates the directory and another rule writes a file into it, we want to
    // defer scanning until both of them have been scanned and possibly run.
    // Having a 'must scan after' would help with the first rule (mkdir), but
    // not the second, in particular if rules are added in subsequent builds.
    // Related rdar://problem/30638921
    ti.request(BuildKey::makeNode(path).toData(), /*inputID=*/0);
    ti.request(BuildKey::makeStat(path).toData(), /*inputID=*/1);
  }